

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# braille.hpp
# Opt level: O1

BrailleCanvas * __thiscall plot::BrailleCanvas::push(BrailleCanvas *this)

{
  forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  *this_00;
  forward_list<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
  *pfVar1;
  _Fwd_list_node_base *p_Var2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  _Node *p_Var6;
  _Fwd_list_node_base *__keep;
  _Fwd_list_node_base *__to;
  value_type local_28;
  
  this_00 = &this->available_layers_;
  if ((this->available_layers_).
      super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      ._M_impl._M_head._M_next == (_Fwd_list_node_base *)0x0) {
    local_28.color._8_8_ = this->lines_;
    local_28.color._0_8_ = this->cols_;
    p_Var6 = std::
             _Fwd_list_base<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
             ::_M_create_node<plot::GenericPoint<long>>
                       ((_Fwd_list_base<plot::detail::braille::image_t,std::allocator<plot::detail::braille::image_t>>
                         *)this_00,(GenericPoint<long> *)&local_28);
    (p_Var6->super__Fwd_list_node_base)._M_next =
         (this->available_layers_).
         super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
         ._M_impl._M_head._M_next;
    (this->available_layers_).
    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
    ._M_impl._M_head._M_next = &p_Var6->super__Fwd_list_node_base;
  }
  pfVar1 = &this->stack_;
  p_Var2 = (this->available_layers_).
           super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           ._M_impl._M_head._M_next;
  if (p_Var2 != (_Fwd_list_node_base *)pfVar1) {
    if (p_Var2 == (_Fwd_list_node_base *)0x0) {
      (this_00->
      super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      )._M_impl._M_head._M_next = (_Fwd_list_node_base *)0x0;
    }
    else {
      (this_00->
      super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
      )._M_impl._M_head._M_next = p_Var2->_M_next;
      p_Var2->_M_next =
           (pfVar1->
           super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           )._M_impl._M_head._M_next;
    }
    (pfVar1->
    super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
    )._M_impl._M_head._M_next = p_Var2;
  }
  p_Var2 = (this->stack_).
           super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
           ._M_impl._M_head._M_next;
  pbVar4 = (this->blocks_).
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->blocks_).
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = (this->blocks_).
           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           .
           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2[1]._M_next;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2[2]._M_next;
  (this->blocks_).
  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
  super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var2[3]._M_next;
  p_Var2[1]._M_next = (_Fwd_list_node_base *)pbVar4;
  p_Var2[2]._M_next = (_Fwd_list_node_base *)pbVar5;
  p_Var2[3]._M_next = (_Fwd_list_node_base *)pbVar3;
  local_28.color.r = 0.0;
  local_28.color.g = 0.0;
  local_28.color.b = 0.0;
  local_28.color.a = 0.0;
  local_28.pixels = '\0';
  local_28._17_3_ = 0;
  std::vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>::
  _M_fill_assign(&(this->blocks_).
                  super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                 ,((long)(this->blocks_).
                         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         .
                         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->blocks_).
                         super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         .
                         super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333,
                 &local_28);
  return this;
}

Assistant:

BrailleCanvas& push() {
        if (available_layers_.empty())
            available_layers_.emplace_front(char_size());

        stack_.splice_after(stack_.before_begin(), available_layers_, available_layers_.before_begin());
        blocks_.swap(stack_.front());
        blocks_.clear();
        return *this;
    }